

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O0

bool tinyjson::json_parser::parse_array(json_node *value,char **token,string *err)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  json_node *pjVar4;
  size_t sVar5;
  long lVar6;
  string *this;
  json_node *local_278;
  json_node *current_value;
  array *root;
  string *err_local;
  char **token_local;
  json_node *value_local;
  json_node *local_248;
  int local_23c;
  string *local_238;
  undefined1 local_22d;
  int local_22c;
  string *local_228;
  undefined1 local_21d;
  int local_21c;
  string *local_218;
  undefined1 local_20d;
  int local_20c;
  string *local_208;
  undefined1 local_1fd;
  int local_1fc;
  string *local_1f8;
  undefined1 local_1e9;
  char local_1e8 [8];
  char buf_1 [64];
  Storage local_170;
  double number;
  string local_158 [8];
  string str_value;
  char local_118 [8];
  char buf [64];
  char *end;
  Storage local_60;
  double value_1;
  char *end_1;
  Storage *local_48;
  char local_39;
  Storage local_38;
  json_node *local_30;
  
  root = (array *)err;
  err_local = (string *)token;
  token_local = (char **)value;
  pjVar4 = (json_node *)operator_new(0x18);
  memset(pjVar4,0,0x18);
  std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::vector
            ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)pjVar4);
  local_1f8 = err_local;
  local_1fc = 0x5d;
  current_value = pjVar4;
  sVar5 = strspn(*(char **)err_local," \t\n\r");
  *(size_t *)local_1f8 = sVar5 + *(long *)local_1f8;
  local_1e9 = **(char **)local_1f8 == local_1fc;
  if ((bool)local_1e9) {
    *(long *)local_1f8 = *(long *)local_1f8 + 1;
    *(undefined4 *)(token_local + 1) = 4;
    *token_local = (char *)current_value;
    return true;
  }
  do {
    pjVar4 = (json_node *)operator_new(0x10);
    local_248 = pjVar4;
    memset(pjVar4,0,8);
    pjVar4->type = null_type;
    local_208 = err_local;
    local_20c = 0x7b;
    local_278 = pjVar4;
    sVar5 = strspn(*(char **)err_local," \t\n\r");
    *(size_t *)local_208 = sVar5 + *(long *)local_208;
    local_1fd = **(char **)local_208 == local_20c;
    if ((bool)local_1fd) {
      *(long *)local_208 = *(long *)local_208 + 1;
      bVar2 = parse_object(local_278,(char **)err_local,(string *)root);
      if (!bVar2) {
        return false;
      }
    }
    else {
      local_218 = err_local;
      local_21c = 0x5b;
      sVar5 = strspn(*(char **)err_local," \t\n\r");
      psVar1 = err_local;
      pjVar4 = local_278;
      *(size_t *)local_218 = sVar5 + *(long *)local_218;
      local_20d = **(char **)local_218 == local_21c;
      if ((bool)local_20d) {
        *(long *)local_218 = *(long *)local_218 + 1;
        bVar2 = parse_array(local_278,(char **)err_local,(string *)root);
        if (!bVar2) {
          return false;
        }
      }
      else {
        str_value.field_2._8_8_ = root;
        if (**(char **)err_local == '\"') {
          std::__cxx11::string::string(local_158);
          if (**(char **)psVar1 == '\"') {
            *(long *)psVar1 = *(long *)psVar1 + 1;
          }
          lVar6 = *(long *)psVar1;
          sVar5 = strcspn(*(char **)psVar1,"\"");
          lVar6 = lVar6 + sVar5;
          std::__cxx11::string::clear();
          if (*(long *)psVar1 == lVar6) {
            *(long *)psVar1 = lVar6 + 1;
          }
          else {
            std::__cxx11::string::assign((char *)local_158,*(ulong *)psVar1);
            *(long *)psVar1 = lVar6 + 1;
          }
          pjVar4->type = string_type;
          this = (string *)operator_new(0x20);
          std::__cxx11::string::string((string *)this,local_158);
          (pjVar4->storage).str_val = this;
          std::__cxx11::string::~string(local_158);
LAB_001066f2:
          bVar2 = true;
        }
        else {
          if ((**(char **)err_local == 't') &&
             (iVar3 = strncmp(*(char **)err_local,"true",4), iVar3 == 0)) {
            pjVar4->type = boolean_type;
            (pjVar4->storage).bool_val = true;
            *(long *)psVar1 = *(long *)psVar1 + 4;
            goto LAB_001066f2;
          }
          if ((**(char **)psVar1 == 'f') &&
             (iVar3 = strncmp(*(char **)psVar1,"false",5), iVar3 == 0)) {
            pjVar4->type = boolean_type;
            (pjVar4->storage).bool_val = false;
            *(long *)psVar1 = *(long *)psVar1 + 5;
            goto LAB_001066f2;
          }
          if ((**(char **)psVar1 == 'n') && (iVar3 = strncmp(*(char **)psVar1,"null",4), iVar3 == 0)
             ) {
            *(long *)psVar1 = *(long *)psVar1 + 4;
            goto LAB_001066f2;
          }
          local_170.num_val = 0.0;
          local_48 = &local_170;
          end_1 = (char *)psVar1;
          sVar5 = strspn(*(char **)psVar1," \t");
          *(size_t *)end_1 = sVar5 + *(long *)end_1;
          lVar6 = *(long *)end_1;
          sVar5 = strcspn(*(char **)end_1," \t,\n\r}]");
          value_1 = (double)(lVar6 + sVar5);
          if ((char *)value_1 == *(char **)end_1) {
            local_39 = '\0';
          }
          else {
            bVar2 = atod(*(char **)end_1,(char *)value_1,&local_60.num_val);
            if (bVar2) {
              *local_48 = local_60;
              *(double *)end_1 = value_1;
              local_39 = '\x01';
            }
            else {
              local_39 = '\0';
            }
          }
          if (local_39 != '\0') {
            local_30 = pjVar4;
            local_38 = local_170;
            pjVar4->type = number_type;
            pjVar4->storage = local_170;
            goto LAB_001066f2;
          }
          buf[0x38] = str_value.field_2._8_1_;
          buf[0x39] = str_value.field_2._9_1_;
          buf[0x3a] = str_value.field_2._10_1_;
          buf[0x3b] = str_value.field_2._11_1_;
          buf[0x3c] = str_value.field_2._12_1_;
          buf[0x3d] = str_value.field_2._13_1_;
          buf[0x3e] = str_value.field_2._14_1_;
          buf[0x3f] = str_value.field_2._15_1_;
          snprintf(local_118,0x40,"%s","parse error.");
          std::__cxx11::string::operator=((string *)buf._56_8_,local_118);
          bVar2 = false;
        }
        if (!bVar2) {
          return false;
        }
      }
    }
    std::vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>>::
    emplace_back<tinyjson::json_node*&>
              ((vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>> *)current_value,
               &local_278);
    local_228 = err_local;
    local_22c = 0x2c;
    sVar5 = strspn(*(char **)err_local," \t\n\r");
    *(size_t *)local_228 = sVar5 + *(long *)local_228;
    local_21d = **(char **)local_228 == local_22c;
    if (!(bool)local_21d) {
      local_238 = err_local;
      local_23c = 0x5d;
      sVar5 = strspn(*(char **)err_local," \t\n\r");
      *(size_t *)local_238 = sVar5 + *(long *)local_238;
      local_22d = **(char **)local_238 == local_23c;
      if (!(bool)local_22d) {
        buf_1._56_8_ = root;
        snprintf(local_1e8,0x40,"%s","invalid end of array.");
        std::__cxx11::string::operator=((string *)buf_1._56_8_,local_1e8);
        return false;
      }
      *(long *)local_238 = *(long *)local_238 + 1;
      *(undefined4 *)(token_local + 1) = 4;
      *token_local = (char *)current_value;
      return true;
    }
    *(long *)local_228 = *(long *)local_228 + 1;
  } while( true );
}

Assistant:

static bool parse_array(json_node& value, const char** token, std::string& err) {
      array* root = new array();

      // empty array
      if (expect_token(token, token_type::end_array)) {
        value.set(root);
        return true;
      }

      do {
        json_node* current_value = new json_node();
        if (expect_token(token, token_type::start_object)) {
          if (!parse_object(*current_value, token, err)) return false;
        } else if (expect_token(token, token_type::start_array)) {
          if (!parse_array(*current_value, token, err)) return false;
        } else {
          if (!parse_value(*current_value, token, err)) return false;
        }
        root->emplace_back(current_value);
      } while(expect_token(token, token_type::comma));

      if (!expect_token(token, token_type::end_array)) {
        return make_err_msg("invalid end of array.", err);
      }

      value.set(root);
      return true;
    }